

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSetRotation.cpp
# Opt level: O0

void testQuatSetRotation(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing quaternion rotations");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_960b8::specificVectors();
  anon_unknown.dwarf_960b8::randomVectors();
  anon_unknown.dwarf_960b8::nearlyEqualVectors();
  anon_unknown.dwarf_960b8::nearlyOppositeVectors();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testQuatSetRotation ()
{
    cout << "Testing quaternion rotations" << endl;

    specificVectors ();
    randomVectors ();
    nearlyEqualVectors ();
    nearlyOppositeVectors ();

    cout << "ok\n" << endl;
}